

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

LibraryIncludeStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::LibraryIncludeStatementSyntax,slang::syntax::LibraryIncludeStatementSyntax_const&>
          (BumpAllocator *this,LibraryIncludeStatementSyntax *args)

{
  LibraryIncludeStatementSyntax *pLVar1;
  LibraryIncludeStatementSyntax *in_RSI;
  size_t in_RDI;
  size_t unaff_retaddr;
  
  pLVar1 = (LibraryIncludeStatementSyntax *)allocate((BumpAllocator *)args,unaff_retaddr,in_RDI);
  slang::syntax::LibraryIncludeStatementSyntax::LibraryIncludeStatementSyntax(in_RSI,pLVar1);
  return pLVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }